

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkPrintDistrib(Wlc_Ntk_t *p,int fTwoSides,int fVerbose)

{
  Wlc_Obj_t *pWVar1;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  void *pvVar2;
  ulong uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  undefined4 *__ptr;
  void *pvVar7;
  Vec_Ptr_t *vTypes;
  void **__ptr_00;
  Vec_Ptr_t *vOccurs;
  void **__ptr_01;
  undefined8 *puVar8;
  void *pvVar9;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  word Entry;
  ulong uVar14;
  Wlc_Obj_t *pWVar15;
  Wlc_Obj_t *pWVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  char *pcVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint *puVar24;
  int i;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  double dVar30;
  int nObjs [2] [60];
  void *local_270;
  uint local_218 [60];
  uint auStack_128 [62];
  
  memset(local_218,0,0x1e0);
  __ptr = (undefined4 *)malloc(0x10);
  *__ptr = 0x3c;
  pvVar7 = calloc(1,0xf0);
  *(void **)(__ptr + 2) = pvVar7;
  __ptr[1] = 0x3c;
  bVar28 = (p->vPos).nSize != 2;
  bVar29 = fTwoSides == 0;
  if (!bVar29 && !bVar28) {
    Wlc_NtkCollectStats(p,(int (*) [60])local_218);
  }
  vTypes = (Vec_Ptr_t *)malloc(0x10);
  vTypes->nCap = 0x3c;
  __ptr_00 = (void **)calloc(1,0x1e0);
  vTypes->pArray = __ptr_00;
  vTypes->nSize = 0x3c;
  vOccurs = (Vec_Ptr_t *)malloc(0x10);
  vOccurs->nCap = 0x3c;
  __ptr_01 = (void **)calloc(1,0x1e0);
  vOccurs->pArray = __ptr_01;
  vOccurs->nSize = 0x3c;
  lVar25 = 0;
  do {
    puVar8 = (undefined8 *)malloc(0x10);
    *puVar8 = 0x10;
    pvVar9 = malloc(0x80);
    puVar8[1] = pvVar9;
    __ptr_00[lVar25] = puVar8;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x3c);
  lVar25 = 0;
  do {
    puVar8 = (undefined8 *)malloc(0x10);
    *puVar8 = 0x10;
    pvVar9 = malloc(0x80);
    puVar8[1] = pvVar9;
    __ptr_01[lVar25] = puVar8;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x3c);
  if (1 < p->iObj) {
    uVar26 = 1;
    iVar6 = 0x3c;
    iVar19 = 0;
    Entry = 0;
    pWVar15 = (Wlc_Obj_t *)0x0;
    local_270 = pvVar7;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar26) goto LAB_0036bb0a;
      pWVar1 = p->pObjs + uVar26;
      iVar21 = pWVar1->Beg;
      iVar5 = pWVar1->End - iVar21;
      iVar12 = -iVar5;
      if (0 < iVar5) {
        iVar12 = iVar5;
      }
      if (iVar12 * 2 - 0x1ffffeU < 0xffe00000) {
        printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",
               uVar26 & 0xffffffff,(ulong)(iVar12 + 1U),(ulong)(iVar12 + 1U & 0xfffff));
        iVar21 = pWVar1->Beg;
      }
      pWVar16 = pWVar15;
      if (pWVar15 == (Wlc_Obj_t *)0x0) {
        pWVar16 = pWVar1;
      }
      if (iVar21 == 0) {
        pWVar16 = pWVar15;
      }
      uVar4 = *(ushort *)pWVar1;
      if ((uVar4 & 0x3d) == 1) {
LAB_00369d2a:
        iVar5 = pWVar1->End - iVar21;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        Entry = (word)((uVar4 >> 6 & 1) + iVar12 * 2 + 2);
      }
      else {
        uVar17 = uVar4 & 0x3f;
        if (uVar17 < 0x36) {
          if ((0x24000007408080U >> uVar17 & 1) == 0) {
            if ((0x800040UL >> uVar17 & 1) != 0) goto LAB_00369d2a;
            goto LAB_00369eda;
          }
          iVar5 = pWVar1->End - iVar21;
          iVar12 = -iVar5;
          if (0 < iVar5) {
            iVar12 = iVar5;
          }
          paVar10 = &pWVar1->field_10;
          if (((short)uVar17 == 0x16) || (2 < pWVar1->nFanins)) {
            paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
          }
          iVar5 = paVar10->Fanins[0];
LAB_00369d94:
          lVar25 = (long)iVar5;
          if ((lVar25 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0036bb0a;
          iVar12 = (uVar4 >> 6 & 1) + iVar12 * 2;
          pWVar15 = p->pObjs;
          iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
          iVar5 = -iVar22;
          if (0 < iVar22) {
            iVar5 = iVar22;
          }
          uVar14 = (ulong)((*(uint *)(pWVar15 + lVar25) >> 6 & 1) + iVar5 * 2 + 2) << 0x15;
        }
        else {
LAB_00369eda:
          uVar18 = pWVar1->nFanins;
          if (uVar18 == 1) {
            iVar5 = pWVar1->End - iVar21;
            iVar12 = -iVar5;
            if (0 < iVar5) {
              iVar12 = iVar5;
            }
            if ((uVar17 | 0x10) == 0x16) {
              paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
            }
            else {
              paVar10 = &pWVar1->field_10;
            }
            iVar5 = paVar10->Fanins[0];
            goto LAB_00369d94;
          }
          if (uVar18 == 0) {
            pcVar11 = Wlc_ObjName(p,(int)uVar26);
            printf("Object %d with name \"%s\" has type 0. Looks like it was declared by not defined...\n"
                   ,uVar26 & 0xffffffff,pcVar11);
            uVar4 = *(ushort *)pWVar1;
            goto LAB_00369dec;
          }
          if ((int)uVar18 < 2) {
            __assert_fail("Wlc_ObjFaninNum(pObj) >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                          ,0x22d,"void Wlc_NtkPrintDistrib(Wlc_Ntk_t *, int, int)");
          }
          iVar5 = pWVar1->End - iVar21;
          iVar12 = -iVar5;
          if (0 < iVar5) {
            iVar12 = iVar5;
          }
          if (uVar18 == 2) {
            if ((uVar17 | 0x10) == 0x16) {
              puVar24 = (uint *)(pWVar1->field_10).pFanins[0];
              uVar23 = *puVar24;
            }
            else {
              uVar23 = (pWVar1->field_10).Fanins[0];
              puVar24 = (uint *)(ulong)uVar23;
            }
            if (uVar23 == 0) {
              uVar23 = 0;
            }
            else {
              uVar23 = (uint)puVar24;
              if ((uVar17 | 0x10) == 0x16) goto LAB_0036b58b;
LAB_0036b593:
              if (((int)uVar23 < 1) || (p->nObjsAlloc <= (int)uVar23)) goto LAB_0036bb0a;
              pWVar15 = p->pObjs;
              iVar22 = pWVar15[uVar23].End - pWVar15[uVar23].Beg;
              iVar5 = -iVar22;
              if (0 < iVar22) {
                iVar5 = iVar22;
              }
              uVar23 = (*(uint *)(pWVar15 + uVar23) >> 6 & 1) + iVar5 * 2 + 2;
              if (uVar18 != 2) goto LAB_0036b61d;
            }
            if ((uVar17 | 0x10) == 0x16) goto LAB_0036b61d;
            if ((pWVar1->field_10).Fanins[1] != 0) {
LAB_0036b642:
              if ((uVar17 | 0x10) == 0x16) goto LAB_0036b64d;
              paVar10 = &pWVar1->field_10;
              goto LAB_0036b652;
            }
LAB_0036b6a6:
            uVar14 = 0;
          }
          else {
            if (*(pWVar1->field_10).pFanins[0] != 0) {
LAB_0036b58b:
              uVar23 = *(pWVar1->field_10).pFanins[0];
              goto LAB_0036b593;
            }
            uVar23 = 0;
LAB_0036b61d:
            if ((pWVar1->field_10).pFanins[0][1] == 0) goto LAB_0036b6a6;
            if (uVar18 == 2) goto LAB_0036b642;
LAB_0036b64d:
            paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
LAB_0036b652:
            lVar25 = (long)paVar10->Fanins[1];
            if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[1])) goto LAB_0036bb0a;
            pWVar15 = p->pObjs;
            iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
            iVar5 = -iVar22;
            if (0 < iVar22) {
              iVar5 = iVar22;
            }
            uVar14 = (ulong)((*(uint *)(pWVar15 + lVar25) >> 6 & 1) + iVar5 * 2 + 2) << 0x2a;
          }
          iVar12 = (uVar4 >> 6 & 1) + iVar12 * 2;
          uVar14 = (ulong)uVar23 << 0x15 | uVar14;
        }
        Entry = iVar12 + 2 | uVar14;
      }
LAB_00369dec:
      uVar4 = uVar4 & 0x3f;
      if (0x3b < uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p_00 = (Vec_Wrd_t *)__ptr_00[uVar4];
      p_01 = (Vec_Wrd_t *)__ptr_01[uVar4];
      if (0 < (long)p_00->nSize) {
        lVar25 = 0;
        do {
          if (p_00->pArray[lVar25] == Entry) {
            if (p_01->nSize <= (int)lVar25) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1e0,"word Vec_WrdAddToEntry(Vec_Wrd_t *, int, word)");
            }
            p_01->pArray[lVar25] = p_01->pArray[lVar25] + 1;
            goto LAB_00369e5f;
          }
          lVar25 = lVar25 + 1;
        } while (p_00->nSize != lVar25);
      }
      Vec_WrdPush(p_00,Entry);
      Vec_WrdPush(p_01,1);
LAB_00369e5f:
      switch(*(ushort *)pWVar1 & 0x3f) {
      case 8:
        iVar6 = __ptr[1];
        if (iVar6 < 9) {
LAB_0036bb67:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        iVar5 = pWVar1->End - pWVar1->Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x20) =
             *(int *)((long)local_270 + 0x20) + (pWVar1->nFanins - 2) * (iVar12 * 3 + 3);
        break;
      case 9:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 10) goto LAB_0036bb67;
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar17 = -uVar18;
        if (0 < (int)uVar18) {
          uVar17 = uVar18;
        }
        uVar18 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar17 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar17 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        uVar18 = iVar12 + 1U;
        if (uVar17 <= iVar12 + 1U) {
          uVar18 = uVar17;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x24) = *(int *)((long)local_270 + 0x24) + uVar18 * 3;
        break;
      case 10:
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar17 = -uVar18;
        if (0 < (int)uVar18) {
          uVar17 = uVar18;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0xb) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        uVar18 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar23 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar23 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        if (iVar12 + 1U < uVar23) {
          uVar23 = iVar12 + 1U;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x28) =
             *(int *)((long)local_270 + 0x28) + (uVar17 * 3 + 3) * uVar23;
        break;
      case 0xb:
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar17 = -uVar18;
        if (0 < (int)uVar18) {
          uVar17 = uVar18;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0xc) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        uVar18 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar23 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar23 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        if (iVar12 + 1U < uVar23) {
          uVar23 = iVar12 + 1U;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x2c) =
             *(int *)((long)local_270 + 0x2c) + (uVar17 * 3 + 3) * uVar23;
        break;
      case 0xc:
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar17 = -uVar18;
        if (0 < (int)uVar18) {
          uVar17 = uVar18;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0xd) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        uVar18 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar23 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar23 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        if (iVar12 + 1U < uVar23) {
          uVar23 = iVar12 + 1U;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x30) =
             *(int *)((long)local_270 + 0x30) + (uVar17 * 3 + 3) * uVar23;
        break;
      case 0xd:
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar17 = -uVar18;
        if (0 < (int)uVar18) {
          uVar17 = uVar18;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0xe) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        uVar18 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar23 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar23 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        if (iVar12 + 1U < uVar23) {
          uVar23 = iVar12 + 1U;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x34) =
             *(int *)((long)local_270 + 0x34) + (uVar17 * 3 + 3) * uVar23;
        break;
      case 0xe:
        uVar18 = pWVar1->End - pWVar1->Beg;
        uVar17 = -uVar18;
        if (0 < (int)uVar18) {
          uVar17 = uVar18;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0xf) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        uVar18 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar23 = 1;
        if (pWVar1->End != pWVar1->Beg) {
          uVar23 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        if (iVar12 + 1U < uVar23) {
          uVar23 = iVar12 + 1U;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x38) =
             *(int *)((long)local_270 + 0x38) + (uVar17 * 3 + 3) * uVar23;
        break;
      case 0xf:
        iVar6 = __ptr[1];
        if (iVar6 < 0x10) goto LAB_0036bb67;
        break;
      case 0x10:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x11) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x40) = iVar12 + *(int *)((long)local_270 + 0x40) + 1;
        break;
      case 0x11:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x12) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x44) = iVar12 + *(int *)((long)local_270 + 0x44) + 1;
        break;
      case 0x12:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x13) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x48) = iVar12 * 3 + *(int *)((long)local_270 + 0x48) + 3;
        break;
      case 0x13:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x14) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x4c) = iVar12 + *(int *)((long)local_270 + 0x4c) + 1;
        break;
      case 0x14:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x15) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x50) = iVar12 + *(int *)((long)local_270 + 0x50) + 1;
        break;
      case 0x15:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x16) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x54) = iVar12 * 3 + *(int *)((long)local_270 + 0x54) + 3;
        break;
      case 0x16:
        iVar6 = __ptr[1];
        if (iVar6 < 0x17) goto LAB_0036bb67;
        break;
      case 0x17:
        iVar6 = __ptr[1];
        if (iVar6 < 0x18) goto LAB_0036bb67;
        break;
      case 0x18:
        iVar6 = __ptr[1];
        if (iVar6 < 0x19) goto LAB_0036bb67;
        break;
      case 0x19:
        iVar6 = __ptr[1];
        if (iVar6 < 0x1a) goto LAB_0036bb67;
        break;
      case 0x1a:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x1b) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x68) = *(int *)((long)local_270 + 0x68) + iVar12;
        break;
      case 0x1b:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) {
LAB_0036bb0a:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar15 = p->pObjs;
        iVar6 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar6;
        if (0 < iVar6) {
          iVar12 = iVar6;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x1c) goto LAB_0036bb67;
        iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar22;
        if (0 < iVar22) {
          iVar5 = iVar22;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x6c) = iVar12 + iVar5 + *(int *)((long)local_270 + 0x6c) + 1;
        break;
      case 0x1c:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        pWVar15 = p->pObjs;
        iVar6 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar6;
        if (0 < iVar6) {
          iVar12 = iVar6;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x1d) goto LAB_0036bb67;
        iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar22;
        if (0 < iVar22) {
          iVar5 = iVar22;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x70) = iVar12 + iVar5 + *(int *)((long)local_270 + 0x70) + 1;
        break;
      case 0x1d:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        pWVar15 = p->pObjs;
        iVar6 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar6;
        if (0 < iVar6) {
          iVar12 = iVar6;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x1e) goto LAB_0036bb67;
        iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar22;
        if (0 < iVar22) {
          iVar5 = iVar22;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x74) = iVar12 + iVar5 + *(int *)((long)local_270 + 0x74) + 1;
        break;
      case 0x1e:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        pWVar15 = p->pObjs;
        iVar6 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar6;
        if (0 < iVar6) {
          iVar12 = iVar6;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x1f) goto LAB_0036bb67;
        iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar22;
        if (0 < iVar22) {
          iVar5 = iVar22;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x78) = iVar12 + iVar5 + *(int *)((long)local_270 + 0x78) + 3;
        break;
      case 0x1f:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x20) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x7c) = *(int *)((long)local_270 + 0x7c) + iVar12 * 4 + 3;
        break;
      case 0x20:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x21) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x80) = *(int *)((long)local_270 + 0x80) + iVar12 * 4 + 3;
        break;
      case 0x21:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x22) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x84) = *(int *)((long)local_270 + 0x84) + iVar12 * 6;
        break;
      case 0x22:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x23) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x88) = *(int *)((long)local_270 + 0x88) + iVar12 * 6;
        break;
      case 0x23:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x24) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x8c) = *(int *)((long)local_270 + 0x8c) + iVar12 * 6;
        break;
      case 0x24:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x25) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x90) = *(int *)((long)local_270 + 0x90) + iVar12 * 6;
        break;
      case 0x25:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x26) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x94) = *(int *)((long)local_270 + 0x94) + iVar12;
        break;
      case 0x26:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x27) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x98) = *(int *)((long)local_270 + 0x98) + iVar12;
        break;
      case 0x27:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x28) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0x9c) = *(int *)((long)local_270 + 0x9c) + iVar12 * 3;
        break;
      case 0x28:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x29) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0xa0) = *(int *)((long)local_270 + 0xa0) + iVar12;
        break;
      case 0x29:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x2a) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0xa4) = *(int *)((long)local_270 + 0xa4) + iVar12;
        break;
      case 0x2a:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x2b) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0xa8) = *(int *)((long)local_270 + 0xa8) + iVar12 * 3;
        break;
      case 0x2b:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x2c) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0xac) = iVar12 * 9 + *(int *)((long)local_270 + 0xac) + 9;
        break;
      case 0x2c:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x2d) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0xb0) = iVar12 * 9 + *(int *)((long)local_270 + 0xb0) + 9;
        break;
      case 0x2d:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        pWVar15 = p->pObjs;
        iVar6 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar6;
        if (0 < iVar6) {
          iVar12 = iVar6;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x2e) goto LAB_0036bb67;
        iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar22;
        if (0 < iVar22) {
          iVar5 = iVar22;
        }
        local_270 = *(void **)(__ptr + 2);
        *(int *)((long)local_270 + 0xb4) =
             *(int *)((long)local_270 + 0xb4) + (iVar5 + 1) * (iVar12 * 9 + 9);
        break;
      case 0x2e:
        uVar17 = pWVar1->nFanins;
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 = p->nObjsAlloc, (int)uVar18 <= paVar10->Fanins[0]))
        goto LAB_0036bb0a;
        pWVar15 = p->pObjs;
        iVar6 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar6;
        if (0 < iVar6) {
          iVar12 = iVar6;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar6;
        if (0 < iVar6) {
          iVar5 = iVar6;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x2f) goto LAB_0036bb67;
        iVar13 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar22 = -iVar13;
        if (0 < iVar13) {
          iVar22 = iVar13;
        }
        *(int *)((long)local_270 + 0xb8) =
             iVar22 * -0x13 + (iVar5 + 1) * (iVar12 * 0xd + 0xd) + *(int *)((long)local_270 + 0xb8)
             + -9;
        break;
      case 0x2f:
        uVar17 = pWVar1->nFanins;
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 = p->nObjsAlloc, (int)uVar18 <= paVar10->Fanins[0]))
        goto LAB_0036bb0a;
        pWVar15 = p->pObjs;
        iVar6 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar6;
        if (0 < iVar6) {
          iVar12 = iVar6;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar6;
        if (0 < iVar6) {
          iVar5 = iVar6;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar6 = __ptr[1];
        if (iVar6 < 0x30) goto LAB_0036bb67;
        iVar13 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar22 = -iVar13;
        if (0 < iVar13) {
          iVar22 = iVar13;
        }
        *(int *)((long)local_270 + 0xbc) =
             iVar22 * -7 + (iVar5 + 1) * (iVar12 * 0xd + 0xd) + *(int *)((long)local_270 + 0xbc) +
             -9;
        break;
      case 0x30:
        uVar17 = pWVar1->nFanins;
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 = p->nObjsAlloc, (int)uVar18 <= paVar10->Fanins[0]))
        goto LAB_0036bb0a;
        pWVar15 = p->pObjs;
        iVar5 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar22;
        if (0 < iVar22) {
          iVar5 = iVar22;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0036bb0a;
        if (iVar6 < 0x31) goto LAB_0036bb67;
        iVar13 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar22 = -iVar13;
        if (0 < iVar13) {
          iVar22 = iVar13;
        }
        *(int *)((long)local_270 + 0xc0) =
             iVar22 * -7 + (iVar5 + 1) * (iVar12 * 0xd + 0xd) + *(int *)((long)local_270 + 0xc0) +
             -9;
        break;
      case 0x31:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        pWVar15 = p->pObjs;
        iVar5 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar22;
        if (0 < iVar22) {
          iVar5 = iVar22;
        }
        dVar30 = pow((double)(iVar12 + 1),(double)(iVar5 + 1));
        if (iVar6 < 0x32) goto LAB_0036bb67;
        *(int *)((long)local_270 + 0xc4) = *(int *)((long)local_270 + 0xc4) + (int)dVar30 * 10;
        break;
      case 0x32:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        if (iVar6 < 0x33) goto LAB_0036bb67;
        iVar5 = p->pObjs[lVar25].End - p->pObjs[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        *(int *)((long)local_270 + 200) = *(int *)((long)local_270 + 200) + iVar12 * 4 + 4;
        break;
      case 0x33:
        uVar17 = pWVar1->nFanins;
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 = p->nObjsAlloc, (int)uVar18 <= paVar10->Fanins[0]))
        goto LAB_0036bb0a;
        pWVar15 = p->pObjs;
        iVar5 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0036bb0a;
        iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar22;
        if (0 < iVar22) {
          iVar5 = iVar22;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < uVar17) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (uVar18 <= (uint)paVar10->Fanins[0])) goto LAB_0036bb0a;
        if (iVar6 < 0x34) goto LAB_0036bb67;
        iVar13 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar22 = -iVar13;
        if (0 < iVar13) {
          iVar22 = iVar13;
        }
        *(uint *)((long)local_270 + 0xcc) =
             (iVar22 * 5 + 5U >> 1) +
             ((uint)((iVar5 + 1) * (iVar12 * 0xb + 0xb)) >> 3) + *(int *)((long)local_270 + 0xcc) +
             -5;
        break;
      case 0x34:
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[0];
        if ((lVar25 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0036bb0a;
        pWVar15 = p->pObjs;
        iVar5 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar12 = -iVar5;
        if (0 < iVar5) {
          iVar12 = iVar5;
        }
        paVar10 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar10->pFanins[0];
        }
        lVar25 = (long)paVar10->Fanins[1];
        if ((lVar25 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar10->Fanins[1])) goto LAB_0036bb0a;
        if (iVar6 < 0x35) goto LAB_0036bb67;
        iVar22 = pWVar15[lVar25].End - pWVar15[lVar25].Beg;
        iVar5 = -iVar22;
        if (0 < iVar22) {
          iVar5 = iVar22;
        }
        *(int *)((long)local_270 + 0xd0) =
             *(int *)((long)local_270 + 0xd0) + (iVar5 + 1) * (iVar12 * 5 + 5);
      }
      iVar19 = iVar19 + (uint)(iVar21 != 0);
      uVar26 = uVar26 + 1;
      pWVar15 = pWVar16;
    } while ((long)uVar26 < (long)p->iObj);
    if ((iVar19 != 0) && (0 < (p->vNameIds).nSize)) {
      printf("Warning: %d objects of the design have non-zero-based ranges.\n");
      uVar26 = ((long)pWVar16 - (long)p->pObjs >> 3) * -0x5555555555555555;
      uVar17 = (uint)uVar26;
      if (((int)uVar17 < 0) || ((p->vNameIds).nSize <= (int)uVar17)) {
LAB_0036bb29:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pcVar11 = Abc_NamStr(p->pManName,(p->vNameIds).pArray[uVar17 & 0x7fffffff]);
      iVar19 = pWVar16->End - pWVar16->Beg;
      iVar6 = -iVar19;
      if (0 < iVar19) {
        iVar6 = iVar19;
      }
      printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",uVar26 & 0xffffffff
             ,pcVar11,(ulong)(iVar6 + 1));
    }
  }
  pcVar11 = "     Left Share Right";
  if (bVar29 || bVar28) {
    pcVar11 = "";
  }
  printf("ID  :  name  occurrence%s    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n"
         ,pcVar11);
  pcVar11 = "-";
  uVar26 = 0;
  do {
    if (p->nObjs[uVar26] != 0) {
      pvVar9 = __ptr_00[uVar26];
      pvVar2 = __ptr_01[uVar26];
      printf("%2d  :  %-8s  %6d",uVar26 & 0xffffffff,Wlc_Names[uVar26]);
      if (!bVar29 && !bVar28) {
        if (uVar26 == 1) {
          iVar6 = Wlc_NtkCountRealPis(p);
        }
        else {
          iVar6 = p->nObjs[uVar26];
        }
        printf("   ");
        uVar17 = local_218[uVar26];
        printf("%6d",(ulong)uVar17);
        uVar18 = auStack_128[uVar26];
        printf("%6d",(ulong)((uVar17 - iVar6) + uVar18));
        printf("%6d",(ulong)uVar18);
      }
      if ((long)(int)__ptr[1] <= (long)uVar26) goto LAB_0036bb29;
      printf("%8d ",(ulong)*(uint *)((long)pvVar7 + uVar26 * 4));
      Wlc_NtkPrintDistribSortOne(vTypes,vOccurs,(int)uVar26);
      if (0 < *(int *)((long)pvVar9 + 4)) {
        uVar14 = 0;
        do {
          uVar3 = *(ulong *)(*(long *)((long)pvVar9 + 8) + uVar14 * 8);
          if (((((int)(uVar14 / 6) * 6 + 5U == (uint)uVar14) && (0x3ffffffffff < uVar3)) ||
              (((~(uint)uVar14 & 7) == 0 && (uVar3 < 0x40000000000)))) &&
             (printf("\n                                "), !bVar29 && !bVar28)) {
            printf("                     ");
          }
          if ((long)*(int *)((long)pvVar2 + 4) <= (long)uVar14) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
          }
          uVar27 = uVar3 >> 0x15;
          printf("(%d)",(ulong)*(uint *)(*(long *)((long)pvVar2 + 8) + uVar14 * 8));
          pcVar20 = pcVar11;
          if ((uVar3 & 1) == 0) {
            pcVar20 = "";
          }
          printf("%s%d",pcVar20,(ulong)((uint)(uVar3 >> 1) & 0xfffff));
          if ((uVar27 & 0x1fffff) != 0) {
            pcVar20 = pcVar11;
            if ((uVar27 & 1) == 0) {
              pcVar20 = "";
            }
            printf("=%s%d",pcVar20,(ulong)(((uint)uVar27 & 0x1fffff) >> 1));
          }
          if (0x3ffffffffff < uVar3) {
            pcVar20 = pcVar11;
            if ((uVar3 >> 0x2a & 1) == 0) {
              pcVar20 = "";
            }
            printf(".%s%d",pcVar20,uVar3 >> 0x2b);
          }
          putchar(0x20);
          uVar14 = uVar14 + 1;
        } while ((long)uVar14 < (long)*(int *)((long)pvVar9 + 4));
      }
      putchar(10);
    }
    uVar26 = uVar26 + 1;
    if (uVar26 == 0x3c) {
      lVar25 = 0;
      do {
        pvVar7 = __ptr_00[lVar25];
        if (pvVar7 != (void *)0x0) {
          if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar7 + 8));
          }
          free(pvVar7);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x3c);
      free(__ptr_00);
      free(vTypes);
      lVar25 = 0;
      do {
        pvVar7 = __ptr_01[lVar25];
        if (pvVar7 != (void *)0x0) {
          if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar7 + 8));
          }
          free(pvVar7);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x3c);
      free(__ptr_01);
      free(vOccurs);
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
      }
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

void Wlc_NtkPrintDistrib( Wlc_Ntk_t * p, int fTwoSides, int fVerbose )
{
    int nObjs[2][WLC_OBJ_NUMBER] = {{0}}; // counter of objects of each type
    Wlc_Obj_t * pObj, * pObjRange = NULL; int nCountRange = 0;
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( WLC_OBJ_NUMBER );
    word Sign = 0;
    int i, k, s, s0, s1;
    if ( Wlc_NtkPoNum(p) != 2 )
        fTwoSides = 0;
    if ( fTwoSides )
        Wlc_NtkCollectStats( p, nObjs );
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( WLC_OBJ_NUMBER );
    vOccurs = Vec_PtrStart( WLC_OBJ_NUMBER );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Wlc_NtkForEachObj( p, pObj, i )
    {
//        char * pName = Wlc_ObjName(p, i);
        if ( Wlc_ObjSign(pObj) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Wlc_ObjRange(pObj), Wlc_ObjRange(pObj) & 0xFFFFF );
        if ( pObj->Beg )
        {
            if ( pObjRange == NULL )
                pObjRange = pObj;
            nCountRange++;
        }
        // 0-input types
        if ( Wlc_ObjIsCi(pObj) || pObj->Type == WLC_OBJ_CONST || pObj->Type == WLC_OBJ_BIT_CONCAT )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), 0, 0 );
        // 1-input types
        else if ( pObj->Type == WLC_OBJ_BUF    || pObj->Type == WLC_OBJ_BIT_SELECT  || pObj->Type == WLC_OBJ_TABLE ||
             pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT || 
             pObj->Type == WLC_OBJ_BIT_NOT     || pObj->Type == WLC_OBJ_LOGIC_NOT   || pObj->Type == WLC_OBJ_ARI_MINUS )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        // 2-input types (including MUX)
        else if ( Wlc_ObjFaninNum(pObj) == 0 )
            printf( "Object %d with name \"%s\" has type 0. Looks like it was declared by not defined...\n", i, Wlc_ObjName(p, i) );
        else if ( Wlc_ObjFaninNum(pObj) == 1 )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        else
        {
            assert( Wlc_ObjFaninNum(pObj) >= 2 );
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjFaninId(pObj, 0) ? Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)) : 0, Wlc_ObjFaninId(pObj, 1) ? Wlc_ObjSign(Wlc_ObjFanin1(p, pObj)) : 0 );
        }
        // add to storage
        Wlc_NtkPrintDistribAddOne( vTypes, vOccurs, pObj->Type, Sign );
        // count the number of AIG nodes
        if ( pObj->Type == WLC_OBJ_MUX )
            Vec_IntAddToEntry( vAnds, WLC_OBJ_MUX,      3 * Wlc_ObjRange(pObj) * (Wlc_ObjFaninNum(pObj) - 2) );
        else if ( pObj->Type == WLC_OBJ_SHIFT_R )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_R,  Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_RA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_RA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_L )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_L,  Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_LA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_LA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_R )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_R, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_L )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_L, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_BIT_NOT )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_AND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_AND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_OR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_OR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_XOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_XOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NAND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NAND,     Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NOR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOR,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NXOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NXOR, 3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_SELECT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SELECT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_CONCAT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_CONCAT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_ZEROPAD )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_ZEROPAD, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_SIGNEXT )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SIGNEXT, 0 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_NOT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_NOT,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_IMPL )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_IMPL,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_AND )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_AND,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_OR )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_OR,         Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_XOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_XOR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) + 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_EQU )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_EQU,     4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_NOTEQU )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_NOTEQU,  4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESS )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESS,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MORE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MORE,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESSEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESSEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MOREEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MOREEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_AND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_AND,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_OR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_OR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_XOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_XOR,   3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NAND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NAND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NOR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NXOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NXOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_ARI_ADD )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_ADD,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SUB )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SUB,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MULTI,    9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_DIVIDE )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_DIVIDE,  13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 19 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + 10 );
        else if ( pObj->Type == WLC_OBJ_ARI_REM )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_REM,     13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_MODULUS )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MODULUS, 13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_POWER ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_POWER,   10 * (int)pow((double)Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)),(double)Wlc_ObjRange(Wlc_ObjFanin0(p, pObj))) );
        else if ( pObj->Type == WLC_OBJ_ARI_MINUS )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MINUS,    4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SQRT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQRT,    11 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 8 + 5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 2 - 5  );
        else if ( pObj->Type == WLC_OBJ_ARI_SQUARE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQUARE,   5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj))  );
    }
    if ( nCountRange && Vec_IntSize(&p->vNameIds) > 0 )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", Wlc_ObjId(p, pObjRange), 
            Abc_NamStr(p->pManName, Wlc_ObjNameId(p, Wlc_ObjId(p, pObjRange))), Wlc_ObjRange(pObjRange), pObjRange->End, pObjRange->Beg );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence%s    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n", fTwoSides ? "     Left Share Right":"" );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d", i, Wlc_Names[i], p->nObjs[i] );
        if ( fTwoSides )
        {
            int nTotal = i == WLC_OBJ_PI ? Wlc_NtkCountRealPis(p) : p->nObjs[i];
            printf( "   " );
            printf( "%6d", nObjs[0][i] );
            printf( "%6d", nObjs[0][i]+nObjs[1][i]-nTotal );
            printf( "%6d", nObjs[1][i] );
        }
        printf( "%8d ", Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Wlc_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Wlc_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
            {
                printf( "\n                                " );
                if ( fTwoSides )
                    printf( "                     " );
            }
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}